

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_valid_public_key(uint8_t *public_key,uECC_Curve curve)

{
  char cVar1;
  int iVar2;
  uECC_word_t _public [8];
  uECC_word_t auStack_68 [9];
  
  cVar1 = curve->num_bytes;
  uECC_vli_bytesToNative(auStack_68,public_key,(int)cVar1);
  uECC_vli_bytesToNative(auStack_68 + curve->num_words,public_key + cVar1,(int)cVar1);
  iVar2 = uECC_valid_point(auStack_68,curve);
  return iVar2;
}

Assistant:

int uECC_valid_public_key(const uint8_t *public_key, uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
    uECC_vli_bytesToNative(
        _public + curve->num_words, public_key + curve->num_bytes, curve->num_bytes);
#endif
    return uECC_valid_point(_public, curve);
}